

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O1

EVP_CIPHER * anon_unknown.dwarf_b39048::RC4Loader::getRC4(void)

{
  int iVar1;
  RC4Loader *this;
  RC4Loader *in_RSI;
  
  if ((anonymous_namespace)::RC4Loader::getRC4()::loader == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::RC4Loader::getRC4()::loader);
    if (iVar1 != 0) {
      this = (RC4Loader *)operator_new(0x18);
      RC4Loader(this);
      std::shared_ptr<(anonymous_namespace)::RC4Loader>::
      shared_ptr<(anonymous_namespace)::RC4Loader,void>
                ((shared_ptr<(anonymous_namespace)::RC4Loader> *)this,in_RSI);
      __cxa_atexit(std::__shared_ptr<(anonymous_namespace)::RC4Loader,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&getRC4::loader,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::RC4Loader::getRC4()::loader);
    }
  }
  return (getRC4::loader.
          super___shared_ptr<(anonymous_namespace)::RC4Loader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         rc4;
}

Assistant:

EVP_CIPHER const*
RC4Loader::getRC4()
{
    static auto loader = std::shared_ptr<RC4Loader>(new RC4Loader());
    return loader->rc4;
}